

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ThreadState.cpp
# Opt level: O0

ThreadState * axl::spy::getCurrentThreadState(bool createIfNotExists)

{
  byte bVar1;
  TlsValue *value;
  ThreadState *pTVar2;
  byte in_DIL;
  Ptr<axl::spy::ThreadState> newState;
  ThreadState *currentState;
  TlsMgr *tlsMgr;
  ThreadState *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff98;
  ThreadState *in_stack_ffffffffffffffa0;
  Ptr local_30 [16];
  ThreadState *local_20;
  undefined7 in_stack_fffffffffffffff0;
  TlsMgr *in_stack_fffffffffffffff8;
  
  bVar1 = in_DIL & 1;
  value = (TlsValue *)sys::getTlsMgr();
  local_20 = (ThreadState *)
             sys::TlsMgr::getSlotValuePtr
                       ((TlsMgr *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((local_20 == (ThreadState *)0x0) && ((bVar1 & 1) != 0)) {
    pTVar2 = (ThreadState *)mem::allocate(0x153c35);
    ThreadState::ThreadState(in_stack_ffffffffffffffa0);
    rc::primeRefCount<axl::spy::ThreadState>(pTVar2,(FreeFunc *)in_stack_ffffffffffffff88);
    rc::Ptr<axl::spy::ThreadState>::Ptr<axl::spy::ThreadState>
              ((Ptr<axl::spy::ThreadState> *)pTVar2,in_stack_ffffffffffffff88);
    rc::Ptr<void>::Ptr<axl::spy::ThreadState>
              ((Ptr<void> *)pTVar2,(Ptr<axl::spy::ThreadState> *)in_stack_ffffffffffffff88);
    sys::TlsMgr::setSlotValue
              (in_stack_fffffffffffffff8,CONCAT17(bVar1,in_stack_fffffffffffffff0),value);
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x153cac);
    pTVar2 = rc::Ptr::operator_cast_to_ThreadState_(local_30);
    rc::Ptr<axl::spy::ThreadState>::~Ptr((Ptr<axl::spy::ThreadState> *)0x153ccf);
    local_20 = pTVar2;
  }
  return local_20;
}

Assistant:

ThreadState*
getCurrentThreadState(bool createIfNotExists) {
	ASSERT(getCurrentThreadDisableCount() && "thread hooks are not disabled (should be)");

	sys::TlsMgr* tlsMgr = sys::getTlsMgr();
	ThreadState* currentState = (ThreadState*)tlsMgr->getSlotValuePtr(g_threadStateSlot);
	if (currentState || !createIfNotExists)
		return currentState;

	rc::Ptr<ThreadState> newState = AXL_RC_NEW(ThreadState);
	tlsMgr->setSlotValue(g_threadStateSlot, newState);
	return newState;
}